

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O2

int object_delete(object obj)

{
  object_impl_interface_destructor p_Var1;
  int iVar2;
  
  iVar2 = 1;
  if (((obj != (object)0x0) && (obj->interface != (object_interface)0x0)) &&
     (p_Var1 = obj->interface->destructor, p_Var1 != (object_impl_interface_destructor)0x0)) {
    iVar2 = (*p_Var1)(obj,obj->impl);
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      log_write_impl_va("metacall",0x174,"object_delete",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,3,"Invalid object %s destructor",obj->name);
      iVar2 = 2;
    }
  }
  return iVar2;
}

Assistant:

int object_delete(object obj)
{
	if (obj != NULL && obj->interface != NULL && obj->interface->destructor != NULL)
	{
		int error = obj->interface->destructor(obj, obj->impl);

		if (error != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid object %s destructor", obj->name);

			return 2;
		}

		return 0;
	}

	return 1;
}